

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.hpp
# Opt level: O0

bool __thiscall lightconf::group::has<date>(group *this,path *key)

{
  const_iterator first;
  const_iterator last;
  value *this_00;
  undefined1 local_48 [8];
  path key_rest;
  group *parent_group;
  value *result;
  path *key_local;
  group *this_local;
  
  path::path((path *)local_48);
  first = std::begin_abi_cxx11_<lightconf::path>(key);
  last = std::end_abi_cxx11_<lightconf::path>(key);
  this_00 = find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (this,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )first._M_current,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )last._M_current,
                       (group **)
                       &key_rest.parts_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(path *)local_48);
  if (this_00 == (value *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = value::is<date>(this_00);
  }
  path::~path((path *)local_48);
  return this_local._7_1_;
}

Assistant:

inline bool group::has(const path& key) const {
    const value *result;
    const group *parent_group;
    path key_rest;

    result = find_value(std::begin(key), std::end(key), &parent_group, &key_rest);
    if (result) {
        return result->is<T>();
    }
    return false;
}